

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_variable(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *this,render_handler *handler,
                 basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *var,context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      *ctx,bool escaped)

{
  type tVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__args;
  bool bVar2;
  streamstring ss;
  wstring local_1b0 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_190 [11];
  
  tVar1 = var->type_;
  if (tVar1 == lambda2) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
    std::operator<<((wostream *)local_190,
                    "Lambda with render argument is not allowed for regular variables");
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wstring::operator=((wstring *)this,local_1b0);
    std::__cxx11::wstring::~wstring(local_1b0);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_190);
    bVar2 = false;
  }
  else {
    if (tVar1 == lambda) {
      local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
      local_190[0]._M_string_length = 0;
      local_190[0].field_2._M_local_buf[0] = L'\0';
      bVar2 = render_lambda(this,handler,var,ctx,(uint)!escaped,local_190,false);
    }
    else {
      bVar2 = true;
      if (tVar1 != string) {
        return true;
      }
      __args = (var->str_)._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::default_delete<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::default_delete<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_false>
               ._M_head_impl;
      if (escaped) {
        Catch::clara::std::
        function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
        ::operator()(local_190,&this->escape_,__args);
      }
      else {
        std::__cxx11::wstring::wstring((wstring *)local_190,(wstring *)__args);
      }
      std::__cxx11::wstring::append((wstring *)&ctx->line_buffer);
    }
    std::__cxx11::wstring::~wstring((wstring *)local_190);
  }
  return bVar2;
}

Assistant:

bool render_variable(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, bool escaped) {
        if (var->is_string()) {
            const auto& varstr = var->string_value();
            render_result(ctx, escaped ? escape_(varstr) : varstr);
        } else if (var->is_lambda()) {
            const render_lambda_escape escape_opt = escaped ? render_lambda_escape::escape : render_lambda_escape::unescape;
            return render_lambda(handler, var, ctx, escape_opt, {}, false);
        } else if (var->is_lambda2()) {
            using streamstring = std::basic_ostringstream<typename string_type::value_type>;
            streamstring ss;
            ss << "Lambda with render argument is not allowed for regular variables";
            error_message_ = ss.str();
            return false;
        }
        return true;
    }